

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_psbt.cpp
# Opt level: O1

void __thiscall Psbt_SetTxOutOnly_Test::TestBody(Psbt_SetTxOutOnly_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar_2;
  Psbt psbt2;
  Amount amount;
  HDWallet wallet2;
  HDWallet wallet1;
  string path2;
  string path1;
  Psbt psbt;
  Address addr1;
  Address addr2;
  TxOutReference txout_2r;
  TxOut txout_2;
  TxOut txout_1;
  KeyData key1;
  KeyData key2;
  undefined1 local_860 [32];
  AssertHelper local_840;
  _Alloc_hider local_838;
  AssertHelper local_830;
  Psbt local_828;
  Amount local_7a8;
  HDWallet local_798;
  HDWallet local_780;
  string local_768;
  string local_748;
  Psbt local_728;
  undefined1 local_6a8 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_6a0;
  _Alloc_hider local_698;
  uchar local_688 [16];
  pointer local_678;
  pointer local_660;
  pointer local_648;
  TapBranch local_630;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_5b8;
  Script local_5a0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_560;
  Address local_530;
  TxOutReference local_3b8;
  TxOut local_368;
  TxOut local_318;
  KeyData local_2c8;
  KeyData local_178;
  
  cfd::Psbt::Psbt(&local_728);
  local_530._0_8_ = (ulong)local_530.addr_type_ << 0x20;
  local_2c8.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start._0_4_ =
       cfd::core::Psbt::GetTxOutCount(&local_728.super_Psbt);
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)local_6a8,"0","psbt.GetTxOutCount()",&local_530.type_,(uint *)&local_2c8);
  if (local_6a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_530);
    if (local_6a0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_6a0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_psbt.cpp"
               ,0x37b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2c8,(Message *)&local_530);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2c8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_530._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_530._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_530._0_8_ + 8))();
      }
      local_530._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_6a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ByteData::ByteData((ByteData *)local_6a8,&g_psbt_seed1_abi_cxx11_);
  cfd::core::HDWallet::HDWallet(&local_780,(ByteData *)local_6a8);
  if ((void *)CONCAT71(local_6a8._1_7_,local_6a8[0]) != (void *)0x0) {
    operator_delete((void *)CONCAT71(local_6a8._1_7_,local_6a8[0]));
  }
  cfd::core::ByteData::ByteData((ByteData *)local_6a8,&g_psbt_seed2_abi_cxx11_);
  cfd::core::HDWallet::HDWallet(&local_798,(ByteData *)local_6a8);
  if ((void *)CONCAT71(local_6a8._1_7_,local_6a8[0]) != (void *)0x0) {
    operator_delete((void *)CONCAT71(local_6a8._1_7_,local_6a8[0]));
  }
  local_748._M_dataplus._M_p = (pointer)&local_748.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_748,"44h/0h/0h/0/2","");
  local_768._M_dataplus._M_p = (pointer)&local_768.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"44h/0h/0h/0/2","");
  cfd::core::HDWallet::GeneratePubkeyData(&local_2c8,&local_780,kTestnet,&local_748);
  cfd::core::HDWallet::GeneratePubkeyData(&local_178,&local_798,kTestnet,&local_768);
  cfd::core::KeyData::GetPubkey((Pubkey *)&local_530,&local_2c8);
  cfd::core::Address::Address
            ((Address *)local_6a8,kCfdIllegalArgumentError,kVersion0,(Pubkey *)&local_530);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_530._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete((void *)local_530._0_8_);
  }
  cfd::core::KeyData::GetPubkey((Pubkey *)&local_828,&local_178);
  cfd::core::Address::Address(&local_530,kCfdIllegalArgumentError,kVersion0,(Pubkey *)&local_828);
  if (local_828.super_Psbt._vptr_Psbt != (_func_int **)0x0) {
    operator_delete(local_828.super_Psbt._vptr_Psbt);
  }
  cfd::core::Amount::Amount(&local_7a8,100000000);
  cfd::core::TxOut::TxOut(&local_318,&local_7a8,(Address *)local_6a8);
  cfd::core::TxOut::TxOut(&local_368,&local_7a8,&local_530);
  cfd::core::TxOutReference::TxOutReference(&local_3b8,&local_368);
  cfd::core::Psbt::AddTxOut(&local_728.super_Psbt,&local_318);
  cfd::core::Psbt::AddTxOut(&local_728.super_Psbt,&local_3b8);
  local_860._0_4_ = 2;
  local_840.data_._0_4_ = cfd::core::Psbt::GetTxOutCount(&local_728.super_Psbt);
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)&local_828,"2","psbt.GetTxOutCount()",(int *)local_860,(uint *)&local_840);
  if ((char)local_828.super_Psbt._vptr_Psbt == '\0') {
    testing::Message::Message((Message *)local_860);
    if ((undefined8 *)local_828.super_Psbt.wally_psbt_pointer_ == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *local_828.super_Psbt.wally_psbt_pointer_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_840,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_psbt.cpp"
               ,0x38c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_840,(Message *)local_860);
    testing::internal::AssertHelper::~AssertHelper(&local_840);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_860._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((AssertHelperData *)local_860._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_860._0_8_ + 8))();
      }
      local_860._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_828.super_Psbt.wally_psbt_pointer_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Psbt::GetData((ByteData *)local_860,&local_728.super_Psbt);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)&local_828,(ByteData *)local_860);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_840,
             "\"70736274ff01004802000000000200e1f50500000000160014b322bddce633b851ac7370ab454f0b367a0654e500e1f50500000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a55500000000000000\""
             ,"psbt.GetData().GetHex().c_str()",
             "70736274ff01004802000000000200e1f50500000000160014b322bddce633b851ac7370ab454f0b367a0654e500e1f50500000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a55500000000000000"
             ,(char *)local_828.super_Psbt._vptr_Psbt);
  if ((Transaction *)local_828.super_Psbt._vptr_Psbt != &local_828.super_Psbt.base_tx_) {
    operator_delete(local_828.super_Psbt._vptr_Psbt);
  }
  if ((AssertHelperData *)local_860._0_8_ != (AssertHelperData *)0x0) {
    operator_delete((void *)local_860._0_8_);
  }
  if (local_840.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_828);
    if (local_838._M_p == (pointer)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_838._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_860,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_psbt.cpp"
               ,0x38e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_860,(Message *)&local_828);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_860);
    if (local_828.super_Psbt._vptr_Psbt != (_func_int **)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_828.super_Psbt._vptr_Psbt != (_func_int **)0x0)) {
        (**(code **)(*local_828.super_Psbt._vptr_Psbt + 8))();
      }
      local_828.super_Psbt._vptr_Psbt = (_func_int **)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_838,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Psbt::GetData((ByteData *)local_860,&local_728.super_Psbt);
  cfd::Psbt::Psbt(&local_828,(ByteData *)local_860);
  if ((AssertHelperData *)local_860._0_8_ != (AssertHelperData *)0x0) {
    operator_delete((void *)local_860._0_8_);
  }
  cfd::core::Psbt::GetBase64_abi_cxx11_((string *)local_860,&local_828.super_Psbt);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_840,
             "\"cHNidP8BAEgCAAAAAAIA4fUFAAAAABYAFLMivdzmM7hRrHNwq0VPCzZ6BlTlAOH1BQAAAAAWABTKuMU6bo/AKW0c05FaMH1RxJGlVQAAAAAAAAA=\""
             ,"psbt2.GetBase64().c_str()",
             "cHNidP8BAEgCAAAAAAIA4fUFAAAAABYAFLMivdzmM7hRrHNwq0VPCzZ6BlTlAOH1BQAAAAAWABTKuMU6bo/AKW0c05FaMH1RxJGlVQAAAAAAAAA="
             ,(char *)local_860._0_8_);
  if ((AssertHelperData *)local_860._0_8_ != (AssertHelperData *)(local_860 + 0x10)) {
    operator_delete((void *)local_860._0_8_);
  }
  if (local_840.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_860);
    if (local_838._M_p == (pointer)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_838._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_830,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_psbt.cpp"
               ,0x390,pcVar2);
    testing::internal::AssertHelper::operator=(&local_830,(Message *)local_860);
    testing::internal::AssertHelper::~AssertHelper(&local_830);
    if ((AssertHelperData *)local_860._0_8_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_860._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_860._0_8_ + 8))();
      }
      local_860._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_838,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_828.super_Psbt._vptr_Psbt = (_func_int **)&PTR__Psbt_00739740;
  std::
  _Rb_tree<cfd::core::OutPoint,_cfd::core::OutPoint,_std::_Identity<cfd::core::OutPoint>,_std::less<cfd::core::OutPoint>,_std::allocator<cfd::core::OutPoint>_>
  ::~_Rb_tree(&local_828.verify_ignore_map_._M_t);
  cfd::core::Psbt::~Psbt(&local_828.super_Psbt);
  local_3b8.super_AbstractTxOutReference._vptr_AbstractTxOutReference =
       (_func_int **)&PTR__AbstractTxOutReference_007356f0;
  cfd::core::Script::~Script(&local_3b8.super_AbstractTxOutReference.locking_script_);
  local_368.super_AbstractTxOut._vptr_AbstractTxOut = (_func_int **)&PTR__AbstractTxOut_007407d8;
  cfd::core::Script::~Script(&local_368.super_AbstractTxOut.locking_script_);
  local_318.super_AbstractTxOut._vptr_AbstractTxOut = (_func_int **)&PTR__AbstractTxOut_007407d8;
  cfd::core::Script::~Script(&local_318.super_AbstractTxOut.locking_script_);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_530.format_data_);
  cfd::core::Script::~Script(&local_530.redeem_script_);
  local_530.script_tree_.super_TapBranch._vptr_TapBranch =
       (_func_int **)&PTR__TaprootScriptTree_00740b18;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            (&local_530.script_tree_.nodes_);
  cfd::core::TapBranch::~TapBranch(&local_530.script_tree_.super_TapBranch);
  if (local_530.schnorr_pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_530.schnorr_pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_530.pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_530.pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_530.hash_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_530.hash_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_530.address_._M_dataplus._M_p != &local_530.address_.field_2) {
    operator_delete(local_530.address_._M_dataplus._M_p);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_560);
  cfd::core::Script::~Script(&local_5a0);
  local_630._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_00740b18;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_5b8);
  cfd::core::TapBranch::~TapBranch(&local_630);
  if (local_648 != (pointer)0x0) {
    operator_delete(local_648);
  }
  if (local_660 != (pointer)0x0) {
    operator_delete(local_660);
  }
  if (local_678 != (pointer)0x0) {
    operator_delete(local_678);
  }
  if ((uchar *)local_698._M_p != local_688) {
    operator_delete(local_698._M_p);
  }
  cfd::core::KeyData::~KeyData(&local_178);
  cfd::core::KeyData::~KeyData(&local_2c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_768._M_dataplus._M_p != &local_768.field_2) {
    operator_delete(local_768._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_748._M_dataplus._M_p != &local_748.field_2) {
    operator_delete(local_748._M_dataplus._M_p);
  }
  if (local_798.seed_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_798.seed_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_780.seed_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_780.seed_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_728.super_Psbt._vptr_Psbt = (_func_int **)&PTR__Psbt_00739740;
  std::
  _Rb_tree<cfd::core::OutPoint,_cfd::core::OutPoint,_std::_Identity<cfd::core::OutPoint>,_std::less<cfd::core::OutPoint>,_std::allocator<cfd::core::OutPoint>_>
  ::~_Rb_tree(&local_728.verify_ignore_map_._M_t);
  cfd::core::Psbt::~Psbt(&local_728.super_Psbt);
  return;
}

Assistant:

TEST(Psbt, SetTxOutOnly) {
  Psbt psbt;
  EXPECT_EQ(0, psbt.GetTxOutCount());
  
  HDWallet wallet1 = HDWallet(ByteData(g_psbt_seed1));
  HDWallet wallet2 = HDWallet(ByteData(g_psbt_seed2));
  std::string path1 = "44h/0h/0h/0/2";
  std::string path2 = "44h/0h/0h/0/2";
  auto key1 = wallet1.GeneratePubkeyData(NetType::kTestnet, path1);
  auto key2 = wallet2.GeneratePubkeyData(NetType::kTestnet, path2);
  auto addr1 = Address(NetType::kTestnet, WitnessVersion::kVersion0, key1.GetPubkey());
  auto addr2 = Address(NetType::kTestnet, WitnessVersion::kVersion0, key2.GetPubkey());

  Amount amount(100000000);
  TxOut txout_1(amount, addr1);
  TxOut txout_2(amount, addr2);
  TxOutReference txout_2r(txout_2);
  psbt.AddTxOut(txout_1);
  psbt.AddTxOut(txout_2r);
  EXPECT_EQ(2, psbt.GetTxOutCount());

  EXPECT_STREQ("70736274ff01004802000000000200e1f50500000000160014b322bddce633b851ac7370ab454f0b367a0654e500e1f50500000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a55500000000000000", psbt.GetData().GetHex().c_str());
  Psbt psbt2(psbt.GetData());
  EXPECT_STREQ("cHNidP8BAEgCAAAAAAIA4fUFAAAAABYAFLMivdzmM7hRrHNwq0VPCzZ6BlTlAOH1BQAAAAAWABTKuMU6bo/AKW0c05FaMH1RxJGlVQAAAAAAAAA=", psbt2.GetBase64().c_str());
}